

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseCommon.cpp
# Opt level: O0

uint __thiscall
siamese::OriginalPacket::Initialize
          (OriginalPacket *this,Allocator *allocator,SiameseOriginalPacket *packet)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  undefined4 *in_RDX;
  Allocator *in_RDI;
  uint bufferSize;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_14;
  undefined4 local_4;
  
  bVar5 = GrowingAlignedDataBuffer::Initialize
                    ((GrowingAlignedDataBuffer *)CONCAT44(in_RDX[1] + 4,in_stack_ffffffffffffffc8),
                     in_RDI,in_stack_ffffffffffffffbc);
  if (bVar5) {
    uVar1 = in_RDX[1];
    pbVar2 = in_RDI->HugeChunkStart;
    bVar6 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *pbVar2 = bVar6;
      local_4 = 1;
    }
    else {
      bVar3 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x4000) {
        *pbVar2 = bVar3 | 0x80;
        pbVar2[1] = bVar6;
        local_4 = 2;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x10);
        if (uVar1 < 0x200000) {
          *pbVar2 = bVar4 | 0xc0;
          pbVar2[1] = bVar3;
          pbVar2[2] = bVar6;
          local_4 = 3;
        }
        else {
          *pbVar2 = (byte)(uVar1 >> 0x18) | 0xe0;
          pbVar2[1] = bVar4;
          pbVar2[2] = bVar3;
          pbVar2[3] = bVar6;
          local_4 = 4;
        }
      }
    }
    *(undefined4 *)((long)(in_RDI->PreferredWindows).PreallocatedData + 0xc) = local_4;
    memcpy(in_RDI->HugeChunkStart +
           *(uint *)((long)(in_RDI->PreferredWindows).PreallocatedData + 0xc),*(void **)(in_RDX + 2)
           ,(ulong)(uint)in_RDX[1]);
    *(int *)(in_RDI->PreferredWindows).PreallocatedData =
         *(int *)((long)(in_RDI->PreferredWindows).PreallocatedData + 0xc) + in_RDX[1];
    *(undefined4 *)((in_RDI->PreferredWindows).PreallocatedData + 1) = *in_RDX;
    local_14 = *(uint *)((long)(in_RDI->PreferredWindows).PreallocatedData + 0xc);
  }
  else {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

unsigned OriginalPacket::Initialize(pktalloc::Allocator* allocator, const SiameseOriginalPacket& packet)
{
    SIAMESE_DEBUG_ASSERT(allocator && packet.Data && packet.DataBytes > 0 && packet.PacketNum < kColumnPeriod);

    // Allocate space for the packet
    const unsigned bufferSize = kMaxPacketLengthFieldBytes + packet.DataBytes;
    if (!Buffer.Initialize(allocator, bufferSize))
        return 0;

    // Serialize the packet length into the front using a compressed format
    HeaderBytes = SerializeHeader_PacketLength(packet.DataBytes, Buffer.Data);
    SIAMESE_DEBUG_ASSERT(HeaderBytes <= kMaxPacketLengthFieldBytes);

    // Copy packet data after the length
    memcpy(Buffer.Data + HeaderBytes, packet.Data, packet.DataBytes);

    Buffer.Bytes = HeaderBytes + packet.DataBytes;

    Column = packet.PacketNum;

    return HeaderBytes;
}